

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

IdentifierPath * __thiscall
soul::IdentifierPath::operator+
          (IdentifierPath *__return_storage_ptr__,IdentifierPath *this,IdentifierPath *other)

{
  Identifier *pIVar1;
  Identifier i;
  Identifier *__end2;
  Identifier *__begin2;
  ArrayWithPreallocation<soul::Identifier,_8UL> *__range2;
  IdentifierPath *other_local;
  IdentifierPath *this_local;
  IdentifierPath *result;
  
  IdentifierPath(__return_storage_ptr__,this);
  __end2 = ArrayWithPreallocation<soul::Identifier,_8UL>::begin(&other->pathSections);
  pIVar1 = ArrayWithPreallocation<soul::Identifier,_8UL>::end(&other->pathSections);
  for (; __end2 != pIVar1; __end2 = __end2 + 1) {
    addSuffix(__return_storage_ptr__,(Identifier)__end2->name);
  }
  return __return_storage_ptr__;
}

Assistant:

IdentifierPath operator+ (const IdentifierPath& other) const
    {
        IdentifierPath result (*this);

        for (auto i : other.pathSections)
            result.addSuffix (i);

        return result;
    }